

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

uint32_t blockmix_salsa8_xor(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i T_55;
  __m128i T_54;
  __m128i T_53;
  __m128i T_52;
  __m128i T_51;
  __m128i T_50;
  __m128i T_49;
  __m128i T_48;
  __m128i T_47;
  __m128i T_46;
  __m128i T_45;
  __m128i T_44;
  __m128i T_43;
  __m128i T_42;
  __m128i T_41;
  __m128i T_40;
  __m128i T_39;
  __m128i T_38;
  __m128i T_37;
  __m128i T_36;
  __m128i T_35;
  __m128i T_34;
  __m128i T_33;
  __m128i T_32;
  __m128i Y3_1;
  __m128i Y2_1;
  __m128i Y1_1;
  __m128i Y0_1;
  __m128i T_31;
  __m128i T_30;
  __m128i T_29;
  __m128i T_28;
  __m128i T_27;
  __m128i T_26;
  __m128i T_25;
  __m128i T_24;
  __m128i T_23;
  __m128i T_22;
  __m128i T_21;
  __m128i T_20;
  __m128i T_19;
  __m128i T_18;
  __m128i T_17;
  __m128i T_16;
  __m128i T_15;
  __m128i T_14;
  __m128i T_13;
  __m128i T_12;
  __m128i T_11;
  __m128i T_10;
  __m128i T_9;
  __m128i T_8;
  __m128i T_7;
  __m128i T_6;
  __m128i T_5;
  __m128i T_4;
  __m128i T_3;
  __m128i T_2;
  __m128i T_1;
  __m128i T;
  __m128i Y3;
  __m128i Y2;
  __m128i Y1;
  __m128i Y0;
  __m128i X3;
  __m128i X2;
  __m128i X1;
  __m128i X0;
  size_t i;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined8 local_2bf8;
  undefined8 uStack_2bf0;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  ulong local_2bd0;
  int local_1908;
  int iStack_1904;
  int iStack_1900;
  int iStack_18fc;
  int local_18e8;
  int iStack_18e4;
  int iStack_18e0;
  int iStack_18dc;
  int local_18b8;
  int iStack_18b4;
  int iStack_18b0;
  int iStack_18ac;
  int local_1898;
  int iStack_1894;
  int iStack_1890;
  int iStack_188c;
  int local_1878;
  int iStack_1874;
  int iStack_1870;
  int iStack_186c;
  int local_1858;
  int iStack_1854;
  int iStack_1850;
  int iStack_184c;
  int local_1838;
  int iStack_1834;
  int iStack_1830;
  int iStack_182c;
  int local_1818;
  int iStack_1814;
  int iStack_1810;
  int iStack_180c;
  int local_17f8;
  int iStack_17f4;
  int iStack_17f0;
  int iStack_17ec;
  int local_17d8;
  int iStack_17d4;
  int iStack_17d0;
  int iStack_17cc;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  int local_1798;
  int iStack_1794;
  int iStack_1790;
  int iStack_178c;
  int local_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1738;
  int iStack_1734;
  int iStack_1730;
  int iStack_172c;
  int local_1718;
  int iStack_1714;
  int iStack_1710;
  int iStack_170c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  int local_16d8;
  int iStack_16d4;
  int iStack_16d0;
  int iStack_16cc;
  int local_16b8;
  int iStack_16b4;
  int iStack_16b0;
  int iStack_16ac;
  int local_1698;
  int iStack_1694;
  int iStack_1690;
  int iStack_168c;
  int local_1678;
  int iStack_1674;
  int iStack_1670;
  int iStack_166c;
  int local_1658;
  int iStack_1654;
  int iStack_1650;
  int iStack_164c;
  int local_1638;
  int iStack_1634;
  int iStack_1630;
  int iStack_162c;
  int local_1618;
  int iStack_1614;
  int iStack_1610;
  int iStack_160c;
  int local_15f8;
  int iStack_15f4;
  int iStack_15f0;
  int iStack_15ec;
  int local_15d8;
  int iStack_15d4;
  int iStack_15d0;
  int iStack_15cc;
  int local_15b8;
  int iStack_15b4;
  int iStack_15b0;
  int iStack_15ac;
  int local_1598;
  int iStack_1594;
  int iStack_1590;
  int iStack_158c;
  int local_1578;
  int iStack_1574;
  int iStack_1570;
  int iStack_156c;
  int local_1558;
  int iStack_1554;
  int iStack_1550;
  int iStack_154c;
  int local_1538;
  int iStack_1534;
  int iStack_1530;
  int iStack_152c;
  int local_1518;
  int iStack_1514;
  int iStack_1510;
  int iStack_150c;
  int local_14f8;
  int iStack_14f4;
  int iStack_14f0;
  int iStack_14ec;
  int local_14d8;
  int iStack_14d4;
  int iStack_14d0;
  int iStack_14cc;
  int local_14c8;
  int iStack_14c4;
  int iStack_14c0;
  int iStack_14bc;
  int local_14b8;
  int iStack_14b4;
  int iStack_14b0;
  int iStack_14ac;
  int local_1488;
  int iStack_1484;
  int iStack_1480;
  int iStack_147c;
  int local_1468;
  int iStack_1464;
  int iStack_1460;
  int iStack_145c;
  int local_1438;
  int iStack_1434;
  int iStack_1430;
  int iStack_142c;
  int local_1418;
  int iStack_1414;
  int iStack_1410;
  int iStack_140c;
  int local_13f8;
  int iStack_13f4;
  int iStack_13f0;
  int iStack_13ec;
  int local_13d8;
  int iStack_13d4;
  int iStack_13d0;
  int iStack_13cc;
  int local_13b8;
  int iStack_13b4;
  int iStack_13b0;
  int iStack_13ac;
  int local_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  int local_1338;
  int iStack_1334;
  int iStack_1330;
  int iStack_132c;
  int local_1318;
  int iStack_1314;
  int iStack_1310;
  int iStack_130c;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  int local_12b8;
  int iStack_12b4;
  int iStack_12b0;
  int iStack_12ac;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  int local_1218;
  int iStack_1214;
  int iStack_1210;
  int iStack_120c;
  int local_11f8;
  int iStack_11f4;
  int iStack_11f0;
  int iStack_11ec;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  int local_1198;
  int iStack_1194;
  int iStack_1190;
  int iStack_118c;
  int local_1178;
  int iStack_1174;
  int iStack_1170;
  int iStack_116c;
  int local_1158;
  int iStack_1154;
  int iStack_1150;
  int iStack_114c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  int local_1098;
  int iStack_1094;
  int iStack_1090;
  int iStack_108c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  int local_1048;
  int iStack_1044;
  int iStack_1040;
  int iStack_103c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  __m128i T_63;
  __m128i T_62;
  __m128i T_61;
  __m128i T_60;
  __m128i T_59;
  __m128i T_58;
  __m128i T_57;
  __m128i T_56;
  
  uVar4 = in_RCX - 1;
  for (local_2bd0 = 0; local_2bd0 < uVar4; local_2bd0 = local_2bd0 + 1) {
  }
  puVar5 = (ulong *)(in_RDI + (uVar4 * 2 + 1) * 0x40);
  puVar6 = (ulong *)(in_RSI + (uVar4 * 2 + 1) * 0x40);
  local_2be8 = *puVar5 ^ *puVar6;
  uStack_2be0 = puVar5[1] ^ puVar6[1];
  lVar7 = in_RDI + (uVar4 * 2 + 1) * 0x40;
  lVar8 = in_RSI + (uVar4 * 2 + 1) * 0x40;
  uStack_2bf0 = *(ulong *)(lVar7 + 0x18) ^ *(ulong *)(lVar8 + 0x18);
  local_2bf8 = *(ulong *)(lVar7 + 0x10) ^ *(ulong *)(lVar8 + 0x10);
  lVar7 = in_RDI + (uVar4 * 2 + 1) * 0x40;
  lVar8 = in_RSI + (uVar4 * 2 + 1) * 0x40;
  uStack_2c00 = *(ulong *)(lVar7 + 0x28) ^ *(ulong *)(lVar8 + 0x28);
  local_2c08 = *(ulong *)(lVar7 + 0x20) ^ *(ulong *)(lVar8 + 0x20);
  lVar7 = in_RDI + (uVar4 * 2 + 1) * 0x40;
  lVar8 = in_RSI + (uVar4 * 2 + 1) * 0x40;
  uStack_2c10 = *(ulong *)(lVar7 + 0x38) ^ *(ulong *)(lVar8 + 0x38);
  local_2c18 = *(ulong *)(lVar7 + 0x30) ^ *(ulong *)(lVar8 + 0x30);
  for (local_2bd0 = 0; local_2bd0 <= uVar4; local_2bd0 = local_2bd0 + 1) {
    puVar5 = (ulong *)(in_RDI + local_2bd0 * 0x80);
    puVar1 = (ulong *)(in_RDI + 0x10 + local_2bd0 * 0x80);
    puVar2 = (ulong *)(in_RDI + 0x20 + local_2bd0 * 0x80);
    puVar3 = (ulong *)(in_RDI + 0x30 + local_2bd0 * 0x80);
    puVar6 = (ulong *)(in_RSI + local_2bd0 * 0x80);
    uVar10 = local_2be8 ^ *puVar5 ^ *puVar6;
    uVar43 = uStack_2be0 ^ puVar5[1] ^ puVar6[1];
    puVar5 = (ulong *)(in_RSI + 0x10 + local_2bd0 * 0x80);
    uVar11 = local_2bf8 ^ *puVar1 ^ *puVar5;
    uVar44 = uStack_2bf0 ^ puVar1[1] ^ puVar5[1];
    puVar5 = (ulong *)(in_RSI + 0x20 + local_2bd0 * 0x80);
    uVar12 = local_2c08 ^ *puVar2 ^ *puVar5;
    uVar45 = uStack_2c00 ^ puVar2[1] ^ puVar5[1];
    puVar5 = (ulong *)(in_RSI + 0x30 + local_2bd0 * 0x80);
    uVar13 = local_2c18 ^ *puVar3 ^ *puVar5;
    uVar46 = uStack_2c10 ^ puVar3[1] ^ puVar5[1];
    local_1038 = (int)uVar10;
    iStack_1034 = (int)(uVar10 >> 0x20);
    iStack_1030 = (int)uVar43;
    iStack_102c = (int)(uVar43 >> 0x20);
    local_1048 = (int)uVar13;
    iStack_1044 = (int)(uVar13 >> 0x20);
    iStack_1040 = (int)uVar46;
    iStack_103c = (int)(uVar46 >> 0x20);
    uVar14 = uVar11 ^ CONCAT44(iStack_1034 + iStack_1044,(local_1038 + local_1048) * 0x80) ^
             CONCAT44((uint)(iStack_1034 + iStack_1044) >> 0x19,
                      (uint)(local_1038 + local_1048) >> 0x19);
    uVar47 = uVar44 ^ CONCAT44(iStack_102c + iStack_103c,iStack_1030 + iStack_1040) ^
             CONCAT44((uint)(iStack_102c + iStack_103c) >> 0x19,
                      (uint)(iStack_1030 + iStack_1040) >> 0x19);
    local_1058 = (int)uVar14;
    iStack_1054 = (int)(uVar14 >> 0x20);
    iStack_1050 = (int)uVar47;
    iStack_104c = (int)(uVar47 >> 0x20);
    uVar14 = uVar12 ^ CONCAT44(iStack_1054 + iStack_1034,(local_1058 + local_1038) * 0x200) ^
             CONCAT44((uint)(iStack_1054 + iStack_1034) >> 0x17,
                      (uint)(local_1058 + local_1038) >> 0x17);
    uVar47 = uVar45 ^ CONCAT44(iStack_104c + iStack_102c,iStack_1050 + iStack_1030) ^
             CONCAT44((uint)(iStack_104c + iStack_102c) >> 0x17,
                      (uint)(iStack_1050 + iStack_1030) >> 0x17);
    local_1078 = (int)uVar14;
    iStack_1074 = (int)(uVar14 >> 0x20);
    iStack_1070 = (int)uVar47;
    iStack_106c = (int)(uVar47 >> 0x20);
    local_2c18 = uVar13 ^ CONCAT44(iStack_1074 + iStack_1054,(local_1078 + local_1058) * 0x2000) ^
                 CONCAT44((uint)(iStack_1074 + iStack_1054) >> 0x13,
                          (uint)(local_1078 + local_1058) >> 0x13);
    uStack_2c10 = uVar46 ^ CONCAT44(iStack_106c + iStack_104c,iStack_1070 + iStack_1050) ^
                  CONCAT44((uint)(iStack_106c + iStack_104c) >> 0x13,
                           (uint)(iStack_1070 + iStack_1050) >> 0x13);
    local_1098 = (int)local_2c18;
    iStack_1094 = (int)(local_2c18 >> 0x20);
    iStack_1090 = (int)uStack_2c10;
    iStack_108c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1094 + iStack_1074,(local_1098 + local_1078) * 0x40000) ^
             CONCAT44((uint)(iStack_1094 + iStack_1074) >> 0xe,
                      (uint)(local_1098 + local_1078) >> 0xe);
    uVar14 = uVar43 ^ CONCAT44(iStack_108c + iStack_106c,iStack_1090 + iStack_1070) ^
             CONCAT44((uint)(iStack_108c + iStack_106c) >> 0xe,
                      (uint)(iStack_1090 + iStack_1070) >> 0xe);
    local_2bf8 = CONCAT44(local_1058,iStack_104c);
    uStack_2bf0._0_4_ = iStack_1054;
    uStack_2bf0._4_4_ = iStack_1050;
    auVar15._8_4_ = local_1078;
    auVar15._0_8_ = uVar47;
    auVar15._12_4_ = iStack_1074;
    auVar16._0_12_ = local_2c18._4_12_;
    auVar16._12_4_ = local_1098;
    local_10b8 = (int)uVar10;
    iStack_10b4 = (int)(uVar10 >> 0x20);
    iStack_10b0 = (int)uVar14;
    iStack_10ac = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar16._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_10b4 + local_1058,(local_10b8 + iStack_104c) * 0x80) ^
             CONCAT44((uint)(iStack_10b4 + local_1058) >> 0x19,
                      (uint)(local_10b8 + iStack_104c) >> 0x19);
    uVar43 = uStack_2c10 ^ CONCAT44(iStack_10ac + iStack_1050,iStack_10b0 + iStack_1054) ^
             CONCAT44((uint)(iStack_10ac + iStack_1050) >> 0x19,
                      (uint)(iStack_10b0 + iStack_1054) >> 0x19);
    local_10d8 = (int)uVar13;
    iStack_10d4 = (int)(uVar13 >> 0x20);
    iStack_10d0 = (int)uVar43;
    iStack_10cc = (int)(uVar43 >> 0x20);
    uStack_2c00 = auVar15._8_8_;
    uVar13 = uVar47 ^ CONCAT44(iStack_10d4 + iStack_10b4,(local_10d8 + local_10b8) * 0x200) ^
             CONCAT44((uint)(iStack_10d4 + iStack_10b4) >> 0x17,
                      (uint)(local_10d8 + local_10b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_10cc + iStack_10ac,iStack_10d0 + iStack_10b0) ^
             CONCAT44((uint)(iStack_10cc + iStack_10ac) >> 0x17,
                      (uint)(iStack_10d0 + iStack_10b0) >> 0x17);
    local_10f8 = (int)uVar13;
    iStack_10f4 = (int)(uVar13 >> 0x20);
    iStack_10f0 = (int)uVar43;
    iStack_10ec = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_10f4 + iStack_10d4,(local_10f8 + local_10d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_10f4 + iStack_10d4) >> 0x13,
                            (uint)(local_10f8 + local_10d8) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_10ec + iStack_10cc,iStack_10f0 + iStack_10d0) ^
                  CONCAT44((uint)(iStack_10ec + iStack_10cc) >> 0x13,
                           (uint)(iStack_10f0 + iStack_10d0) >> 0x13);
    local_1118 = (int)local_2bf8;
    iStack_1114 = (int)(local_2bf8 >> 0x20);
    iStack_1110 = (int)uStack_2bf0;
    iStack_110c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1114 + iStack_10f4,(local_1118 + local_10f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1114 + iStack_10f4) >> 0xe,
                      (uint)(local_1118 + local_10f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_110c + iStack_10ec,iStack_1110 + iStack_10f0) ^
             CONCAT44((uint)(iStack_110c + iStack_10ec) >> 0xe,
                      (uint)(iStack_1110 + iStack_10f0) >> 0xe);
    auVar17._0_12_ = local_2bf8._4_12_;
    auVar17._12_4_ = local_1118;
    auVar18._8_4_ = local_10f8;
    auVar18._0_8_ = uVar43;
    auVar18._12_4_ = iStack_10f4;
    local_2c18 = CONCAT44(local_10d8,iStack_10cc);
    uStack_2c10._0_4_ = iStack_10d4;
    uStack_2c10._4_4_ = iStack_10d0;
    local_1138 = (int)uVar10;
    iStack_1134 = (int)(uVar10 >> 0x20);
    iStack_1130 = (int)uVar14;
    iStack_112c = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar17._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_1134 + local_10d8,(local_1138 + iStack_10cc) * 0x80) ^
             CONCAT44((uint)(iStack_1134 + local_10d8) >> 0x19,
                      (uint)(local_1138 + iStack_10cc) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_112c + iStack_10d0,iStack_1130 + iStack_10d4) ^
             CONCAT44((uint)(iStack_112c + iStack_10d0) >> 0x19,
                      (uint)(iStack_1130 + iStack_10d4) >> 0x19);
    local_1158 = (int)uVar13;
    iStack_1154 = (int)(uVar13 >> 0x20);
    iStack_1150 = (int)uVar46;
    iStack_114c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar18._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1154 + iStack_1134,(local_1158 + local_1138) * 0x200) ^
             CONCAT44((uint)(iStack_1154 + iStack_1134) >> 0x17,
                      (uint)(local_1158 + local_1138) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_114c + iStack_112c,iStack_1150 + iStack_1130) ^
             CONCAT44((uint)(iStack_114c + iStack_112c) >> 0x17,
                      (uint)(iStack_1150 + iStack_1130) >> 0x17);
    local_1178 = (int)uVar13;
    iStack_1174 = (int)(uVar13 >> 0x20);
    iStack_1170 = (int)uVar43;
    iStack_116c = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_1174 + iStack_1154,(local_1178 + local_1158) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1174 + iStack_1154) >> 0x13,
                            (uint)(local_1178 + local_1158) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_116c + iStack_114c,iStack_1170 + iStack_1150) ^
                  CONCAT44((uint)(iStack_116c + iStack_114c) >> 0x13,
                           (uint)(iStack_1170 + iStack_1150) >> 0x13);
    local_1198 = (int)local_2c18;
    iStack_1194 = (int)(local_2c18 >> 0x20);
    iStack_1190 = (int)uStack_2c10;
    iStack_118c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1194 + iStack_1174,(local_1198 + local_1178) * 0x40000) ^
             CONCAT44((uint)(iStack_1194 + iStack_1174) >> 0xe,
                      (uint)(local_1198 + local_1178) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_118c + iStack_116c,iStack_1190 + iStack_1170) ^
             CONCAT44((uint)(iStack_118c + iStack_116c) >> 0xe,
                      (uint)(iStack_1190 + iStack_1170) >> 0xe);
    local_2bf8 = CONCAT44(local_1158,iStack_114c);
    uStack_2bf0._0_4_ = iStack_1154;
    uStack_2bf0._4_4_ = iStack_1150;
    auVar19._8_4_ = local_1178;
    auVar19._0_8_ = uVar43;
    auVar19._12_4_ = iStack_1174;
    auVar20._0_12_ = local_2c18._4_12_;
    auVar20._12_4_ = local_1198;
    local_11b8 = (int)uVar10;
    iStack_11b4 = (int)(uVar10 >> 0x20);
    iStack_11b0 = (int)uVar14;
    iStack_11ac = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar20._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_11b4 + local_1158,(local_11b8 + iStack_114c) * 0x80) ^
             CONCAT44((uint)(iStack_11b4 + local_1158) >> 0x19,
                      (uint)(local_11b8 + iStack_114c) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_11ac + iStack_1150,iStack_11b0 + iStack_1154) ^
             CONCAT44((uint)(iStack_11ac + iStack_1150) >> 0x19,
                      (uint)(iStack_11b0 + iStack_1154) >> 0x19);
    local_11d8 = (int)uVar13;
    iStack_11d4 = (int)(uVar13 >> 0x20);
    iStack_11d0 = (int)uVar46;
    iStack_11cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar19._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_11d4 + iStack_11b4,(local_11d8 + local_11b8) * 0x200) ^
             CONCAT44((uint)(iStack_11d4 + iStack_11b4) >> 0x17,
                      (uint)(local_11d8 + local_11b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_11cc + iStack_11ac,iStack_11d0 + iStack_11b0) ^
             CONCAT44((uint)(iStack_11cc + iStack_11ac) >> 0x17,
                      (uint)(iStack_11d0 + iStack_11b0) >> 0x17);
    local_11f8 = (int)uVar13;
    iStack_11f4 = (int)(uVar13 >> 0x20);
    iStack_11f0 = (int)uVar43;
    iStack_11ec = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_11f4 + iStack_11d4,(local_11f8 + local_11d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_11f4 + iStack_11d4) >> 0x13,
                            (uint)(local_11f8 + local_11d8) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_11ec + iStack_11cc,iStack_11f0 + iStack_11d0) ^
                  CONCAT44((uint)(iStack_11ec + iStack_11cc) >> 0x13,
                           (uint)(iStack_11f0 + iStack_11d0) >> 0x13);
    local_1218 = (int)local_2bf8;
    iStack_1214 = (int)(local_2bf8 >> 0x20);
    iStack_1210 = (int)uStack_2bf0;
    iStack_120c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1214 + iStack_11f4,(local_1218 + local_11f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1214 + iStack_11f4) >> 0xe,
                      (uint)(local_1218 + local_11f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_120c + iStack_11ec,iStack_1210 + iStack_11f0) ^
             CONCAT44((uint)(iStack_120c + iStack_11ec) >> 0xe,
                      (uint)(iStack_1210 + iStack_11f0) >> 0xe);
    auVar21._0_12_ = local_2bf8._4_12_;
    auVar21._12_4_ = local_1218;
    auVar22._8_4_ = local_11f8;
    auVar22._0_8_ = uVar43;
    auVar22._12_4_ = iStack_11f4;
    local_2c18 = CONCAT44(local_11d8,iStack_11cc);
    uStack_2c10._0_4_ = iStack_11d4;
    uStack_2c10._4_4_ = iStack_11d0;
    local_1238 = (int)uVar10;
    iStack_1234 = (int)(uVar10 >> 0x20);
    iStack_1230 = (int)uVar14;
    iStack_122c = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar21._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_1234 + local_11d8,(local_1238 + iStack_11cc) * 0x80) ^
             CONCAT44((uint)(iStack_1234 + local_11d8) >> 0x19,
                      (uint)(local_1238 + iStack_11cc) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_122c + iStack_11d0,iStack_1230 + iStack_11d4) ^
             CONCAT44((uint)(iStack_122c + iStack_11d0) >> 0x19,
                      (uint)(iStack_1230 + iStack_11d4) >> 0x19);
    local_1258 = (int)uVar13;
    iStack_1254 = (int)(uVar13 >> 0x20);
    iStack_1250 = (int)uVar46;
    iStack_124c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar22._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1254 + iStack_1234,(local_1258 + local_1238) * 0x200) ^
             CONCAT44((uint)(iStack_1254 + iStack_1234) >> 0x17,
                      (uint)(local_1258 + local_1238) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_124c + iStack_122c,iStack_1250 + iStack_1230) ^
             CONCAT44((uint)(iStack_124c + iStack_122c) >> 0x17,
                      (uint)(iStack_1250 + iStack_1230) >> 0x17);
    local_1278 = (int)uVar13;
    iStack_1274 = (int)(uVar13 >> 0x20);
    iStack_1270 = (int)uVar43;
    iStack_126c = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_1274 + iStack_1254,(local_1278 + local_1258) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1274 + iStack_1254) >> 0x13,
                            (uint)(local_1278 + local_1258) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_126c + iStack_124c,iStack_1270 + iStack_1250) ^
                  CONCAT44((uint)(iStack_126c + iStack_124c) >> 0x13,
                           (uint)(iStack_1270 + iStack_1250) >> 0x13);
    local_1298 = (int)local_2c18;
    iStack_1294 = (int)(local_2c18 >> 0x20);
    iStack_1290 = (int)uStack_2c10;
    iStack_128c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1294 + iStack_1274,(local_1298 + local_1278) * 0x40000) ^
             CONCAT44((uint)(iStack_1294 + iStack_1274) >> 0xe,
                      (uint)(local_1298 + local_1278) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_128c + iStack_126c,iStack_1290 + iStack_1270) ^
             CONCAT44((uint)(iStack_128c + iStack_126c) >> 0xe,
                      (uint)(iStack_1290 + iStack_1270) >> 0xe);
    local_2bf8 = CONCAT44(local_1258,iStack_124c);
    uStack_2bf0._0_4_ = iStack_1254;
    uStack_2bf0._4_4_ = iStack_1250;
    auVar23._8_4_ = local_1278;
    auVar23._0_8_ = uVar43;
    auVar23._12_4_ = iStack_1274;
    auVar24._0_12_ = local_2c18._4_12_;
    auVar24._12_4_ = local_1298;
    local_12b8 = (int)uVar10;
    iStack_12b4 = (int)(uVar10 >> 0x20);
    iStack_12b0 = (int)uVar14;
    iStack_12ac = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar24._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_12b4 + local_1258,(local_12b8 + iStack_124c) * 0x80) ^
             CONCAT44((uint)(iStack_12b4 + local_1258) >> 0x19,
                      (uint)(local_12b8 + iStack_124c) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_12ac + iStack_1250,iStack_12b0 + iStack_1254) ^
             CONCAT44((uint)(iStack_12ac + iStack_1250) >> 0x19,
                      (uint)(iStack_12b0 + iStack_1254) >> 0x19);
    local_12d8 = (int)uVar13;
    iStack_12d4 = (int)(uVar13 >> 0x20);
    iStack_12d0 = (int)uVar46;
    iStack_12cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar23._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_12d4 + iStack_12b4,(local_12d8 + local_12b8) * 0x200) ^
             CONCAT44((uint)(iStack_12d4 + iStack_12b4) >> 0x17,
                      (uint)(local_12d8 + local_12b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_12cc + iStack_12ac,iStack_12d0 + iStack_12b0) ^
             CONCAT44((uint)(iStack_12cc + iStack_12ac) >> 0x17,
                      (uint)(iStack_12d0 + iStack_12b0) >> 0x17);
    local_12f8 = (int)uVar13;
    iStack_12f4 = (int)(uVar13 >> 0x20);
    iStack_12f0 = (int)uVar43;
    iStack_12ec = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_12f4 + iStack_12d4,(local_12f8 + local_12d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_12f4 + iStack_12d4) >> 0x13,
                            (uint)(local_12f8 + local_12d8) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_12ec + iStack_12cc,iStack_12f0 + iStack_12d0) ^
                  CONCAT44((uint)(iStack_12ec + iStack_12cc) >> 0x13,
                           (uint)(iStack_12f0 + iStack_12d0) >> 0x13);
    local_1318 = (int)local_2bf8;
    iStack_1314 = (int)(local_2bf8 >> 0x20);
    iStack_1310 = (int)uStack_2bf0;
    iStack_130c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1314 + iStack_12f4,(local_1318 + local_12f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1314 + iStack_12f4) >> 0xe,
                      (uint)(local_1318 + local_12f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_130c + iStack_12ec,iStack_1310 + iStack_12f0) ^
             CONCAT44((uint)(iStack_130c + iStack_12ec) >> 0xe,
                      (uint)(iStack_1310 + iStack_12f0) >> 0xe);
    auVar25._0_12_ = local_2bf8._4_12_;
    auVar25._12_4_ = local_1318;
    auVar26._8_4_ = local_12f8;
    auVar26._0_8_ = uVar43;
    auVar26._12_4_ = iStack_12f4;
    local_2c18 = CONCAT44(local_12d8,iStack_12cc);
    uStack_2c10._0_4_ = iStack_12d4;
    uStack_2c10._4_4_ = iStack_12d0;
    local_1338 = (int)uVar10;
    iStack_1334 = (int)(uVar10 >> 0x20);
    iStack_1330 = (int)uVar14;
    iStack_132c = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar25._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_1334 + local_12d8,(local_1338 + iStack_12cc) * 0x80) ^
             CONCAT44((uint)(iStack_1334 + local_12d8) >> 0x19,
                      (uint)(local_1338 + iStack_12cc) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_132c + iStack_12d0,iStack_1330 + iStack_12d4) ^
             CONCAT44((uint)(iStack_132c + iStack_12d0) >> 0x19,
                      (uint)(iStack_1330 + iStack_12d4) >> 0x19);
    local_1358 = (int)uVar13;
    iStack_1354 = (int)(uVar13 >> 0x20);
    iStack_1350 = (int)uVar46;
    iStack_134c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar26._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1354 + iStack_1334,(local_1358 + local_1338) * 0x200) ^
             CONCAT44((uint)(iStack_1354 + iStack_1334) >> 0x17,
                      (uint)(local_1358 + local_1338) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_134c + iStack_132c,iStack_1350 + iStack_1330) ^
             CONCAT44((uint)(iStack_134c + iStack_132c) >> 0x17,
                      (uint)(iStack_1350 + iStack_1330) >> 0x17);
    local_1378 = (int)uVar13;
    iStack_1374 = (int)(uVar13 >> 0x20);
    iStack_1370 = (int)uVar43;
    iStack_136c = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_1374 + iStack_1354,(local_1378 + local_1358) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1374 + iStack_1354) >> 0x13,
                            (uint)(local_1378 + local_1358) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_136c + iStack_134c,iStack_1370 + iStack_1350) ^
                  CONCAT44((uint)(iStack_136c + iStack_134c) >> 0x13,
                           (uint)(iStack_1370 + iStack_1350) >> 0x13);
    local_1398 = (int)local_2c18;
    iStack_1394 = (int)(local_2c18 >> 0x20);
    iStack_1390 = (int)uStack_2c10;
    iStack_138c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1394 + iStack_1374,(local_1398 + local_1378) * 0x40000) ^
             CONCAT44((uint)(iStack_1394 + iStack_1374) >> 0xe,
                      (uint)(local_1398 + local_1378) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_138c + iStack_136c,iStack_1390 + iStack_1370) ^
             CONCAT44((uint)(iStack_138c + iStack_136c) >> 0xe,
                      (uint)(iStack_1390 + iStack_1370) >> 0xe);
    local_2bf8 = CONCAT44(local_1358,iStack_134c);
    uStack_2bf0._0_4_ = iStack_1354;
    uStack_2bf0._4_4_ = iStack_1350;
    auVar27._8_4_ = local_1378;
    auVar27._0_8_ = uVar43;
    auVar27._12_4_ = iStack_1374;
    auVar28._0_12_ = local_2c18._4_12_;
    auVar28._12_4_ = local_1398;
    local_13b8 = (int)uVar10;
    iStack_13b4 = (int)(uVar10 >> 0x20);
    iStack_13b0 = (int)uVar14;
    iStack_13ac = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar28._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_13b4 + local_1358,(local_13b8 + iStack_134c) * 0x80) ^
             CONCAT44((uint)(iStack_13b4 + local_1358) >> 0x19,
                      (uint)(local_13b8 + iStack_134c) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_13ac + iStack_1350,iStack_13b0 + iStack_1354) ^
             CONCAT44((uint)(iStack_13ac + iStack_1350) >> 0x19,
                      (uint)(iStack_13b0 + iStack_1354) >> 0x19);
    local_13d8 = (int)uVar13;
    iStack_13d4 = (int)(uVar13 >> 0x20);
    iStack_13d0 = (int)uVar46;
    iStack_13cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar27._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_13d4 + iStack_13b4,(local_13d8 + local_13b8) * 0x200) ^
             CONCAT44((uint)(iStack_13d4 + iStack_13b4) >> 0x17,
                      (uint)(local_13d8 + local_13b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_13cc + iStack_13ac,iStack_13d0 + iStack_13b0) ^
             CONCAT44((uint)(iStack_13cc + iStack_13ac) >> 0x17,
                      (uint)(iStack_13d0 + iStack_13b0) >> 0x17);
    local_13f8 = (int)uVar13;
    iStack_13f4 = (int)(uVar13 >> 0x20);
    iStack_13f0 = (int)uVar43;
    iStack_13ec = (int)(uVar43 >> 0x20);
    uVar13 = local_2bf8 ^ CONCAT44(iStack_13f4 + iStack_13d4,(local_13f8 + local_13d8) * 0x2000) ^
             CONCAT44((uint)(iStack_13f4 + iStack_13d4) >> 0x13,
                      (uint)(local_13f8 + local_13d8) >> 0x13);
    uVar43 = uStack_2bf0 ^ CONCAT44(iStack_13ec + iStack_13cc,iStack_13f0 + iStack_13d0) ^
             CONCAT44((uint)(iStack_13ec + iStack_13cc) >> 0x13,
                      (uint)(iStack_13f0 + iStack_13d0) >> 0x13);
    local_1418 = (int)uVar13;
    iStack_1414 = (int)(uVar13 >> 0x20);
    iStack_1410 = (int)uVar43;
    iStack_140c = (int)(uVar43 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1414 + iStack_13f4,(local_1418 + local_13f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1414 + iStack_13f4) >> 0xe,
                      (uint)(local_1418 + local_13f8) >> 0xe);
    uVar13 = uVar14 ^ CONCAT44(iStack_140c + iStack_13ec,iStack_1410 + iStack_13f0) ^
             CONCAT44((uint)(iStack_140c + iStack_13ec) >> 0xe,
                      (uint)(iStack_1410 + iStack_13f0) >> 0xe);
    local_1438 = (int)uVar10;
    iStack_1434 = (int)(uVar10 >> 0x20);
    iStack_1430 = (int)uVar13;
    iStack_142c = (int)(uVar13 >> 0x20);
    local_2be8 = CONCAT44(iStack_1434 + iStack_1034,local_1438 + local_1038);
    uStack_2be0 = CONCAT44(iStack_142c + iStack_102c,iStack_1430 + iStack_1030);
    piVar9 = (int *)(in_RDX + local_2bd0 * 0x40);
    *piVar9 = local_1438 + local_1038;
    piVar9[1] = iStack_1434 + iStack_1034;
    piVar9[2] = iStack_1430 + iStack_1030;
    piVar9[3] = iStack_142c + iStack_102c;
    local_1468 = (int)uVar11;
    iStack_1464 = (int)(uVar11 >> 0x20);
    iStack_1460 = (int)uVar44;
    iStack_145c = (int)(uVar44 >> 0x20);
    local_2bf8 = CONCAT44(iStack_1410 + iStack_1464,iStack_1414 + local_1468);
    uStack_2bf0._0_4_ = iStack_140c + iStack_1460;
    uStack_2bf0._4_4_ = local_1418 + iStack_145c;
    piVar9 = (int *)(in_RDX + 0x10 + local_2bd0 * 0x40);
    *piVar9 = iStack_1414 + local_1468;
    piVar9[1] = iStack_1410 + iStack_1464;
    piVar9[2] = iStack_140c + iStack_1460;
    piVar9[3] = local_1418 + iStack_145c;
    local_1488 = (int)uVar12;
    iStack_1484 = (int)(uVar12 >> 0x20);
    iStack_1480 = (int)uVar45;
    iStack_147c = (int)(uVar45 >> 0x20);
    local_2c08 = CONCAT44(iStack_13ec + iStack_1484,iStack_13f0 + local_1488);
    uStack_2c00._0_4_ = local_13f8 + iStack_1480;
    uStack_2c00._4_4_ = iStack_13f4 + iStack_147c;
    piVar9 = (int *)(in_RDX + 0x20 + local_2bd0 * 0x40);
    *piVar9 = iStack_13f0 + local_1488;
    piVar9[1] = iStack_13ec + iStack_1484;
    piVar9[2] = local_13f8 + iStack_1480;
    piVar9[3] = iStack_13f4 + iStack_147c;
    local_2c18 = CONCAT44(local_13d8 + iStack_1044,iStack_13cc + local_1048);
    uStack_2c10._0_4_ = iStack_13d4 + iStack_1040;
    uStack_2c10._4_4_ = iStack_13d0 + iStack_103c;
    piVar9 = (int *)(in_RDX + 0x30 + local_2bd0 * 0x40);
    *piVar9 = iStack_13cc + local_1048;
    piVar9[1] = local_13d8 + iStack_1044;
    piVar9[2] = iStack_13d4 + iStack_1040;
    piVar9[3] = iStack_13d0 + iStack_103c;
    puVar5 = (ulong *)(in_RDI + 0x40 + local_2bd0 * 0x80);
    puVar6 = (ulong *)(in_RDI + 0x50 + local_2bd0 * 0x80);
    puVar1 = (ulong *)(in_RDI + 0x60 + local_2bd0 * 0x80);
    puVar2 = (ulong *)(in_RDI + 0x70 + local_2bd0 * 0x80);
    puVar3 = (ulong *)(in_RSI + 0x40 + local_2bd0 * 0x80);
    uVar10 = local_2be8 ^ *puVar5 ^ *puVar3;
    uVar43 = uStack_2be0 ^ puVar5[1] ^ puVar3[1];
    puVar5 = (ulong *)(in_RSI + 0x50 + local_2bd0 * 0x80);
    uVar11 = local_2bf8 ^ *puVar6 ^ *puVar5;
    uVar44 = uStack_2bf0 ^ puVar6[1] ^ puVar5[1];
    puVar5 = (ulong *)(in_RSI + 0x60 + local_2bd0 * 0x80);
    uVar12 = local_2c08 ^ *puVar1 ^ *puVar5;
    uVar45 = uStack_2c00 ^ puVar1[1] ^ puVar5[1];
    puVar5 = (ulong *)(in_RSI + 0x70 + local_2bd0 * 0x80);
    uVar13 = local_2c18 ^ *puVar2 ^ *puVar5;
    uVar46 = uStack_2c10 ^ puVar2[1] ^ puVar5[1];
    local_14b8 = (int)uVar10;
    iStack_14b4 = (int)(uVar10 >> 0x20);
    iStack_14b0 = (int)uVar43;
    iStack_14ac = (int)(uVar43 >> 0x20);
    local_14c8 = (int)uVar13;
    iStack_14c4 = (int)(uVar13 >> 0x20);
    iStack_14c0 = (int)uVar46;
    iStack_14bc = (int)(uVar46 >> 0x20);
    uVar14 = uVar11 ^ CONCAT44(iStack_14b4 + iStack_14c4,(local_14b8 + local_14c8) * 0x80) ^
             CONCAT44((uint)(iStack_14b4 + iStack_14c4) >> 0x19,
                      (uint)(local_14b8 + local_14c8) >> 0x19);
    uVar47 = uVar44 ^ CONCAT44(iStack_14ac + iStack_14bc,iStack_14b0 + iStack_14c0) ^
             CONCAT44((uint)(iStack_14ac + iStack_14bc) >> 0x19,
                      (uint)(iStack_14b0 + iStack_14c0) >> 0x19);
    local_14d8 = (int)uVar14;
    iStack_14d4 = (int)(uVar14 >> 0x20);
    iStack_14d0 = (int)uVar47;
    iStack_14cc = (int)(uVar47 >> 0x20);
    uVar14 = uVar12 ^ CONCAT44(iStack_14d4 + iStack_14b4,(local_14d8 + local_14b8) * 0x200) ^
             CONCAT44((uint)(iStack_14d4 + iStack_14b4) >> 0x17,
                      (uint)(local_14d8 + local_14b8) >> 0x17);
    uVar47 = uVar45 ^ CONCAT44(iStack_14cc + iStack_14ac,iStack_14d0 + iStack_14b0) ^
             CONCAT44((uint)(iStack_14cc + iStack_14ac) >> 0x17,
                      (uint)(iStack_14d0 + iStack_14b0) >> 0x17);
    local_14f8 = (int)uVar14;
    iStack_14f4 = (int)(uVar14 >> 0x20);
    iStack_14f0 = (int)uVar47;
    iStack_14ec = (int)(uVar47 >> 0x20);
    local_2c18 = uVar13 ^ CONCAT44(iStack_14f4 + iStack_14d4,(local_14f8 + local_14d8) * 0x2000) ^
                 CONCAT44((uint)(iStack_14f4 + iStack_14d4) >> 0x13,
                          (uint)(local_14f8 + local_14d8) >> 0x13);
    uStack_2c10 = uVar46 ^ CONCAT44(iStack_14ec + iStack_14cc,iStack_14f0 + iStack_14d0) ^
                  CONCAT44((uint)(iStack_14ec + iStack_14cc) >> 0x13,
                           (uint)(iStack_14f0 + iStack_14d0) >> 0x13);
    local_1518 = (int)local_2c18;
    iStack_1514 = (int)(local_2c18 >> 0x20);
    iStack_1510 = (int)uStack_2c10;
    iStack_150c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1514 + iStack_14f4,(local_1518 + local_14f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1514 + iStack_14f4) >> 0xe,
                      (uint)(local_1518 + local_14f8) >> 0xe);
    uVar14 = uVar43 ^ CONCAT44(iStack_150c + iStack_14ec,iStack_1510 + iStack_14f0) ^
             CONCAT44((uint)(iStack_150c + iStack_14ec) >> 0xe,
                      (uint)(iStack_1510 + iStack_14f0) >> 0xe);
    local_2bf8 = CONCAT44(local_14d8,iStack_14cc);
    uStack_2bf0._0_4_ = iStack_14d4;
    uStack_2bf0._4_4_ = iStack_14d0;
    auVar29._8_4_ = local_14f8;
    auVar29._0_8_ = uVar47;
    auVar29._12_4_ = iStack_14f4;
    auVar30._0_12_ = local_2c18._4_12_;
    auVar30._12_4_ = local_1518;
    local_1538 = (int)uVar10;
    iStack_1534 = (int)(uVar10 >> 0x20);
    iStack_1530 = (int)uVar14;
    iStack_152c = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar30._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_1534 + local_14d8,(local_1538 + iStack_14cc) * 0x80) ^
             CONCAT44((uint)(iStack_1534 + local_14d8) >> 0x19,
                      (uint)(local_1538 + iStack_14cc) >> 0x19);
    uVar43 = uStack_2c10 ^ CONCAT44(iStack_152c + iStack_14d0,iStack_1530 + iStack_14d4) ^
             CONCAT44((uint)(iStack_152c + iStack_14d0) >> 0x19,
                      (uint)(iStack_1530 + iStack_14d4) >> 0x19);
    local_1558 = (int)uVar13;
    iStack_1554 = (int)(uVar13 >> 0x20);
    iStack_1550 = (int)uVar43;
    iStack_154c = (int)(uVar43 >> 0x20);
    uStack_2c00 = auVar29._8_8_;
    uVar13 = uVar47 ^ CONCAT44(iStack_1554 + iStack_1534,(local_1558 + local_1538) * 0x200) ^
             CONCAT44((uint)(iStack_1554 + iStack_1534) >> 0x17,
                      (uint)(local_1558 + local_1538) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_154c + iStack_152c,iStack_1550 + iStack_1530) ^
             CONCAT44((uint)(iStack_154c + iStack_152c) >> 0x17,
                      (uint)(iStack_1550 + iStack_1530) >> 0x17);
    local_1578 = (int)uVar13;
    iStack_1574 = (int)(uVar13 >> 0x20);
    iStack_1570 = (int)uVar43;
    iStack_156c = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_1574 + iStack_1554,(local_1578 + local_1558) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1574 + iStack_1554) >> 0x13,
                            (uint)(local_1578 + local_1558) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_156c + iStack_154c,iStack_1570 + iStack_1550) ^
                  CONCAT44((uint)(iStack_156c + iStack_154c) >> 0x13,
                           (uint)(iStack_1570 + iStack_1550) >> 0x13);
    local_1598 = (int)local_2bf8;
    iStack_1594 = (int)(local_2bf8 >> 0x20);
    iStack_1590 = (int)uStack_2bf0;
    iStack_158c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1594 + iStack_1574,(local_1598 + local_1578) * 0x40000) ^
             CONCAT44((uint)(iStack_1594 + iStack_1574) >> 0xe,
                      (uint)(local_1598 + local_1578) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_158c + iStack_156c,iStack_1590 + iStack_1570) ^
             CONCAT44((uint)(iStack_158c + iStack_156c) >> 0xe,
                      (uint)(iStack_1590 + iStack_1570) >> 0xe);
    auVar31._0_12_ = local_2bf8._4_12_;
    auVar31._12_4_ = local_1598;
    auVar32._8_4_ = local_1578;
    auVar32._0_8_ = uVar43;
    auVar32._12_4_ = iStack_1574;
    local_2c18 = CONCAT44(local_1558,iStack_154c);
    uStack_2c10._0_4_ = iStack_1554;
    uStack_2c10._4_4_ = iStack_1550;
    local_15b8 = (int)uVar10;
    iStack_15b4 = (int)(uVar10 >> 0x20);
    iStack_15b0 = (int)uVar14;
    iStack_15ac = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar31._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_15b4 + local_1558,(local_15b8 + iStack_154c) * 0x80) ^
             CONCAT44((uint)(iStack_15b4 + local_1558) >> 0x19,
                      (uint)(local_15b8 + iStack_154c) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_15ac + iStack_1550,iStack_15b0 + iStack_1554) ^
             CONCAT44((uint)(iStack_15ac + iStack_1550) >> 0x19,
                      (uint)(iStack_15b0 + iStack_1554) >> 0x19);
    local_15d8 = (int)uVar13;
    iStack_15d4 = (int)(uVar13 >> 0x20);
    iStack_15d0 = (int)uVar46;
    iStack_15cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar32._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_15d4 + iStack_15b4,(local_15d8 + local_15b8) * 0x200) ^
             CONCAT44((uint)(iStack_15d4 + iStack_15b4) >> 0x17,
                      (uint)(local_15d8 + local_15b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_15cc + iStack_15ac,iStack_15d0 + iStack_15b0) ^
             CONCAT44((uint)(iStack_15cc + iStack_15ac) >> 0x17,
                      (uint)(iStack_15d0 + iStack_15b0) >> 0x17);
    local_15f8 = (int)uVar13;
    iStack_15f4 = (int)(uVar13 >> 0x20);
    iStack_15f0 = (int)uVar43;
    iStack_15ec = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_15f4 + iStack_15d4,(local_15f8 + local_15d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_15f4 + iStack_15d4) >> 0x13,
                            (uint)(local_15f8 + local_15d8) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_15ec + iStack_15cc,iStack_15f0 + iStack_15d0) ^
                  CONCAT44((uint)(iStack_15ec + iStack_15cc) >> 0x13,
                           (uint)(iStack_15f0 + iStack_15d0) >> 0x13);
    local_1618 = (int)local_2c18;
    iStack_1614 = (int)(local_2c18 >> 0x20);
    iStack_1610 = (int)uStack_2c10;
    iStack_160c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1614 + iStack_15f4,(local_1618 + local_15f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1614 + iStack_15f4) >> 0xe,
                      (uint)(local_1618 + local_15f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_160c + iStack_15ec,iStack_1610 + iStack_15f0) ^
             CONCAT44((uint)(iStack_160c + iStack_15ec) >> 0xe,
                      (uint)(iStack_1610 + iStack_15f0) >> 0xe);
    local_2bf8 = CONCAT44(local_15d8,iStack_15cc);
    uStack_2bf0._0_4_ = iStack_15d4;
    uStack_2bf0._4_4_ = iStack_15d0;
    auVar33._8_4_ = local_15f8;
    auVar33._0_8_ = uVar43;
    auVar33._12_4_ = iStack_15f4;
    auVar34._0_12_ = local_2c18._4_12_;
    auVar34._12_4_ = local_1618;
    local_1638 = (int)uVar10;
    iStack_1634 = (int)(uVar10 >> 0x20);
    iStack_1630 = (int)uVar14;
    iStack_162c = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar34._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_1634 + local_15d8,(local_1638 + iStack_15cc) * 0x80) ^
             CONCAT44((uint)(iStack_1634 + local_15d8) >> 0x19,
                      (uint)(local_1638 + iStack_15cc) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_162c + iStack_15d0,iStack_1630 + iStack_15d4) ^
             CONCAT44((uint)(iStack_162c + iStack_15d0) >> 0x19,
                      (uint)(iStack_1630 + iStack_15d4) >> 0x19);
    local_1658 = (int)uVar13;
    iStack_1654 = (int)(uVar13 >> 0x20);
    iStack_1650 = (int)uVar46;
    iStack_164c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar33._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1654 + iStack_1634,(local_1658 + local_1638) * 0x200) ^
             CONCAT44((uint)(iStack_1654 + iStack_1634) >> 0x17,
                      (uint)(local_1658 + local_1638) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_164c + iStack_162c,iStack_1650 + iStack_1630) ^
             CONCAT44((uint)(iStack_164c + iStack_162c) >> 0x17,
                      (uint)(iStack_1650 + iStack_1630) >> 0x17);
    local_1678 = (int)uVar13;
    iStack_1674 = (int)(uVar13 >> 0x20);
    iStack_1670 = (int)uVar43;
    iStack_166c = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_1674 + iStack_1654,(local_1678 + local_1658) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1674 + iStack_1654) >> 0x13,
                            (uint)(local_1678 + local_1658) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_166c + iStack_164c,iStack_1670 + iStack_1650) ^
                  CONCAT44((uint)(iStack_166c + iStack_164c) >> 0x13,
                           (uint)(iStack_1670 + iStack_1650) >> 0x13);
    local_1698 = (int)local_2bf8;
    iStack_1694 = (int)(local_2bf8 >> 0x20);
    iStack_1690 = (int)uStack_2bf0;
    iStack_168c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1694 + iStack_1674,(local_1698 + local_1678) * 0x40000) ^
             CONCAT44((uint)(iStack_1694 + iStack_1674) >> 0xe,
                      (uint)(local_1698 + local_1678) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_168c + iStack_166c,iStack_1690 + iStack_1670) ^
             CONCAT44((uint)(iStack_168c + iStack_166c) >> 0xe,
                      (uint)(iStack_1690 + iStack_1670) >> 0xe);
    auVar35._0_12_ = local_2bf8._4_12_;
    auVar35._12_4_ = local_1698;
    auVar36._8_4_ = local_1678;
    auVar36._0_8_ = uVar43;
    auVar36._12_4_ = iStack_1674;
    local_2c18 = CONCAT44(local_1658,iStack_164c);
    uStack_2c10._0_4_ = iStack_1654;
    uStack_2c10._4_4_ = iStack_1650;
    local_16b8 = (int)uVar10;
    iStack_16b4 = (int)(uVar10 >> 0x20);
    iStack_16b0 = (int)uVar14;
    iStack_16ac = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar35._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_16b4 + local_1658,(local_16b8 + iStack_164c) * 0x80) ^
             CONCAT44((uint)(iStack_16b4 + local_1658) >> 0x19,
                      (uint)(local_16b8 + iStack_164c) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_16ac + iStack_1650,iStack_16b0 + iStack_1654) ^
             CONCAT44((uint)(iStack_16ac + iStack_1650) >> 0x19,
                      (uint)(iStack_16b0 + iStack_1654) >> 0x19);
    local_16d8 = (int)uVar13;
    iStack_16d4 = (int)(uVar13 >> 0x20);
    iStack_16d0 = (int)uVar46;
    iStack_16cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar36._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_16d4 + iStack_16b4,(local_16d8 + local_16b8) * 0x200) ^
             CONCAT44((uint)(iStack_16d4 + iStack_16b4) >> 0x17,
                      (uint)(local_16d8 + local_16b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_16cc + iStack_16ac,iStack_16d0 + iStack_16b0) ^
             CONCAT44((uint)(iStack_16cc + iStack_16ac) >> 0x17,
                      (uint)(iStack_16d0 + iStack_16b0) >> 0x17);
    local_16f8 = (int)uVar13;
    iStack_16f4 = (int)(uVar13 >> 0x20);
    iStack_16f0 = (int)uVar43;
    iStack_16ec = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_16f4 + iStack_16d4,(local_16f8 + local_16d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_16f4 + iStack_16d4) >> 0x13,
                            (uint)(local_16f8 + local_16d8) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_16ec + iStack_16cc,iStack_16f0 + iStack_16d0) ^
                  CONCAT44((uint)(iStack_16ec + iStack_16cc) >> 0x13,
                           (uint)(iStack_16f0 + iStack_16d0) >> 0x13);
    local_1718 = (int)local_2c18;
    iStack_1714 = (int)(local_2c18 >> 0x20);
    iStack_1710 = (int)uStack_2c10;
    iStack_170c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1714 + iStack_16f4,(local_1718 + local_16f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1714 + iStack_16f4) >> 0xe,
                      (uint)(local_1718 + local_16f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_170c + iStack_16ec,iStack_1710 + iStack_16f0) ^
             CONCAT44((uint)(iStack_170c + iStack_16ec) >> 0xe,
                      (uint)(iStack_1710 + iStack_16f0) >> 0xe);
    local_2bf8 = CONCAT44(local_16d8,iStack_16cc);
    uStack_2bf0._0_4_ = iStack_16d4;
    uStack_2bf0._4_4_ = iStack_16d0;
    auVar37._8_4_ = local_16f8;
    auVar37._0_8_ = uVar43;
    auVar37._12_4_ = iStack_16f4;
    auVar38._0_12_ = local_2c18._4_12_;
    auVar38._12_4_ = local_1718;
    local_1738 = (int)uVar10;
    iStack_1734 = (int)(uVar10 >> 0x20);
    iStack_1730 = (int)uVar14;
    iStack_172c = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar38._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_1734 + local_16d8,(local_1738 + iStack_16cc) * 0x80) ^
             CONCAT44((uint)(iStack_1734 + local_16d8) >> 0x19,
                      (uint)(local_1738 + iStack_16cc) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_172c + iStack_16d0,iStack_1730 + iStack_16d4) ^
             CONCAT44((uint)(iStack_172c + iStack_16d0) >> 0x19,
                      (uint)(iStack_1730 + iStack_16d4) >> 0x19);
    local_1758 = (int)uVar13;
    iStack_1754 = (int)(uVar13 >> 0x20);
    iStack_1750 = (int)uVar46;
    iStack_174c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar37._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1754 + iStack_1734,(local_1758 + local_1738) * 0x200) ^
             CONCAT44((uint)(iStack_1754 + iStack_1734) >> 0x17,
                      (uint)(local_1758 + local_1738) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_174c + iStack_172c,iStack_1750 + iStack_1730) ^
             CONCAT44((uint)(iStack_174c + iStack_172c) >> 0x17,
                      (uint)(iStack_1750 + iStack_1730) >> 0x17);
    local_1778 = (int)uVar13;
    iStack_1774 = (int)(uVar13 >> 0x20);
    iStack_1770 = (int)uVar43;
    iStack_176c = (int)(uVar43 >> 0x20);
    local_2bf8 = local_2bf8 ^ CONCAT44(iStack_1774 + iStack_1754,(local_1778 + local_1758) * 0x2000)
                 ^ CONCAT44((uint)(iStack_1774 + iStack_1754) >> 0x13,
                            (uint)(local_1778 + local_1758) >> 0x13);
    uStack_2bf0 = uStack_2bf0 ^ CONCAT44(iStack_176c + iStack_174c,iStack_1770 + iStack_1750) ^
                  CONCAT44((uint)(iStack_176c + iStack_174c) >> 0x13,
                           (uint)(iStack_1770 + iStack_1750) >> 0x13);
    local_1798 = (int)local_2bf8;
    iStack_1794 = (int)(local_2bf8 >> 0x20);
    iStack_1790 = (int)uStack_2bf0;
    iStack_178c = (int)(uStack_2bf0 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1794 + iStack_1774,(local_1798 + local_1778) * 0x40000) ^
             CONCAT44((uint)(iStack_1794 + iStack_1774) >> 0xe,
                      (uint)(local_1798 + local_1778) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_178c + iStack_176c,iStack_1790 + iStack_1770) ^
             CONCAT44((uint)(iStack_178c + iStack_176c) >> 0xe,
                      (uint)(iStack_1790 + iStack_1770) >> 0xe);
    auVar39._0_12_ = local_2bf8._4_12_;
    auVar39._12_4_ = local_1798;
    auVar40._8_4_ = local_1778;
    auVar40._0_8_ = uVar43;
    auVar40._12_4_ = iStack_1774;
    local_2c18 = CONCAT44(local_1758,iStack_174c);
    uStack_2c10._0_4_ = iStack_1754;
    uStack_2c10._4_4_ = iStack_1750;
    local_17b8 = (int)uVar10;
    iStack_17b4 = (int)(uVar10 >> 0x20);
    iStack_17b0 = (int)uVar14;
    iStack_17ac = (int)(uVar14 >> 0x20);
    local_2bf8 = local_2bf8._4_8_;
    uStack_2bf0 = auVar39._8_8_;
    uVar13 = local_2bf8 ^ CONCAT44(iStack_17b4 + local_1758,(local_17b8 + iStack_174c) * 0x80) ^
             CONCAT44((uint)(iStack_17b4 + local_1758) >> 0x19,
                      (uint)(local_17b8 + iStack_174c) >> 0x19);
    uVar46 = uStack_2bf0 ^ CONCAT44(iStack_17ac + iStack_1750,iStack_17b0 + iStack_1754) ^
             CONCAT44((uint)(iStack_17ac + iStack_1750) >> 0x19,
                      (uint)(iStack_17b0 + iStack_1754) >> 0x19);
    local_17d8 = (int)uVar13;
    iStack_17d4 = (int)(uVar13 >> 0x20);
    iStack_17d0 = (int)uVar46;
    iStack_17cc = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar40._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_17d4 + iStack_17b4,(local_17d8 + local_17b8) * 0x200) ^
             CONCAT44((uint)(iStack_17d4 + iStack_17b4) >> 0x17,
                      (uint)(local_17d8 + local_17b8) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_17cc + iStack_17ac,iStack_17d0 + iStack_17b0) ^
             CONCAT44((uint)(iStack_17cc + iStack_17ac) >> 0x17,
                      (uint)(iStack_17d0 + iStack_17b0) >> 0x17);
    local_17f8 = (int)uVar13;
    iStack_17f4 = (int)(uVar13 >> 0x20);
    iStack_17f0 = (int)uVar43;
    iStack_17ec = (int)(uVar43 >> 0x20);
    local_2c18 = local_2c18 ^ CONCAT44(iStack_17f4 + iStack_17d4,(local_17f8 + local_17d8) * 0x2000)
                 ^ CONCAT44((uint)(iStack_17f4 + iStack_17d4) >> 0x13,
                            (uint)(local_17f8 + local_17d8) >> 0x13);
    uStack_2c10 = uStack_2c10 ^ CONCAT44(iStack_17ec + iStack_17cc,iStack_17f0 + iStack_17d0) ^
                  CONCAT44((uint)(iStack_17ec + iStack_17cc) >> 0x13,
                           (uint)(iStack_17f0 + iStack_17d0) >> 0x13);
    local_1818 = (int)local_2c18;
    iStack_1814 = (int)(local_2c18 >> 0x20);
    iStack_1810 = (int)uStack_2c10;
    iStack_180c = (int)(uStack_2c10 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1814 + iStack_17f4,(local_1818 + local_17f8) * 0x40000) ^
             CONCAT44((uint)(iStack_1814 + iStack_17f4) >> 0xe,
                      (uint)(local_1818 + local_17f8) >> 0xe);
    uVar14 = uVar14 ^ CONCAT44(iStack_180c + iStack_17ec,iStack_1810 + iStack_17f0) ^
             CONCAT44((uint)(iStack_180c + iStack_17ec) >> 0xe,
                      (uint)(iStack_1810 + iStack_17f0) >> 0xe);
    local_2bf8 = CONCAT44(local_17d8,iStack_17cc);
    uStack_2bf0._0_4_ = iStack_17d4;
    uStack_2bf0._4_4_ = iStack_17d0;
    auVar41._8_4_ = local_17f8;
    auVar41._0_8_ = uVar43;
    auVar41._12_4_ = iStack_17f4;
    auVar42._0_12_ = local_2c18._4_12_;
    auVar42._12_4_ = local_1818;
    local_1838 = (int)uVar10;
    iStack_1834 = (int)(uVar10 >> 0x20);
    iStack_1830 = (int)uVar14;
    iStack_182c = (int)(uVar14 >> 0x20);
    local_2c18 = local_2c18._4_8_;
    uStack_2c10 = auVar42._8_8_;
    uVar13 = local_2c18 ^ CONCAT44(iStack_1834 + local_17d8,(local_1838 + iStack_17cc) * 0x80) ^
             CONCAT44((uint)(iStack_1834 + local_17d8) >> 0x19,
                      (uint)(local_1838 + iStack_17cc) >> 0x19);
    uVar46 = uStack_2c10 ^ CONCAT44(iStack_182c + iStack_17d0,iStack_1830 + iStack_17d4) ^
             CONCAT44((uint)(iStack_182c + iStack_17d0) >> 0x19,
                      (uint)(iStack_1830 + iStack_17d4) >> 0x19);
    local_1858 = (int)uVar13;
    iStack_1854 = (int)(uVar13 >> 0x20);
    iStack_1850 = (int)uVar46;
    iStack_184c = (int)(uVar46 >> 0x20);
    uStack_2c00 = auVar41._8_8_;
    uVar13 = uVar43 ^ CONCAT44(iStack_1854 + iStack_1834,(local_1858 + local_1838) * 0x200) ^
             CONCAT44((uint)(iStack_1854 + iStack_1834) >> 0x17,
                      (uint)(local_1858 + local_1838) >> 0x17);
    uVar43 = uStack_2c00 ^ CONCAT44(iStack_184c + iStack_182c,iStack_1850 + iStack_1830) ^
             CONCAT44((uint)(iStack_184c + iStack_182c) >> 0x17,
                      (uint)(iStack_1850 + iStack_1830) >> 0x17);
    local_1878 = (int)uVar13;
    iStack_1874 = (int)(uVar13 >> 0x20);
    iStack_1870 = (int)uVar43;
    iStack_186c = (int)(uVar43 >> 0x20);
    uVar13 = local_2bf8 ^ CONCAT44(iStack_1874 + iStack_1854,(local_1878 + local_1858) * 0x2000) ^
             CONCAT44((uint)(iStack_1874 + iStack_1854) >> 0x13,
                      (uint)(local_1878 + local_1858) >> 0x13);
    uVar43 = uStack_2bf0 ^ CONCAT44(iStack_186c + iStack_184c,iStack_1870 + iStack_1850) ^
             CONCAT44((uint)(iStack_186c + iStack_184c) >> 0x13,
                      (uint)(iStack_1870 + iStack_1850) >> 0x13);
    local_1898 = (int)uVar13;
    iStack_1894 = (int)(uVar13 >> 0x20);
    iStack_1890 = (int)uVar43;
    iStack_188c = (int)(uVar43 >> 0x20);
    uVar10 = uVar10 ^ CONCAT44(iStack_1894 + iStack_1874,(local_1898 + local_1878) * 0x40000) ^
             CONCAT44((uint)(iStack_1894 + iStack_1874) >> 0xe,
                      (uint)(local_1898 + local_1878) >> 0xe);
    uVar13 = uVar14 ^ CONCAT44(iStack_188c + iStack_186c,iStack_1890 + iStack_1870) ^
             CONCAT44((uint)(iStack_188c + iStack_186c) >> 0xe,
                      (uint)(iStack_1890 + iStack_1870) >> 0xe);
    local_18b8 = (int)uVar10;
    iStack_18b4 = (int)(uVar10 >> 0x20);
    iStack_18b0 = (int)uVar13;
    iStack_18ac = (int)(uVar13 >> 0x20);
    local_2be8 = CONCAT44(iStack_18b4 + iStack_14b4,local_18b8 + local_14b8);
    uStack_2be0 = CONCAT44(iStack_18ac + iStack_14ac,iStack_18b0 + iStack_14b0);
    piVar9 = (int *)(in_RDX + (in_RCX + local_2bd0) * 0x40);
    *piVar9 = local_18b8 + local_14b8;
    piVar9[1] = iStack_18b4 + iStack_14b4;
    piVar9[2] = iStack_18b0 + iStack_14b0;
    piVar9[3] = iStack_18ac + iStack_14ac;
    local_18e8 = (int)uVar11;
    iStack_18e4 = (int)(uVar11 >> 0x20);
    iStack_18e0 = (int)uVar44;
    iStack_18dc = (int)(uVar44 >> 0x20);
    local_2bf8._4_4_ = iStack_1890 + iStack_18e4;
    local_2bf8._0_4_ = iStack_1894 + local_18e8;
    uStack_2bf0._0_4_ = iStack_188c + iStack_18e0;
    uStack_2bf0._4_4_ = local_1898 + iStack_18dc;
    lVar7 = in_RDX + (in_RCX + local_2bd0) * 0x40;
    *(int *)(lVar7 + 0x10) = iStack_1894 + local_18e8;
    *(int *)(lVar7 + 0x14) = iStack_1890 + iStack_18e4;
    *(int *)(lVar7 + 0x18) = iStack_188c + iStack_18e0;
    *(int *)(lVar7 + 0x1c) = local_1898 + iStack_18dc;
    local_1908 = (int)uVar12;
    iStack_1904 = (int)(uVar12 >> 0x20);
    iStack_1900 = (int)uVar45;
    iStack_18fc = (int)(uVar45 >> 0x20);
    local_2c08._4_4_ = iStack_186c + iStack_1904;
    local_2c08._0_4_ = iStack_1870 + local_1908;
    uStack_2c00._0_4_ = local_1878 + iStack_1900;
    uStack_2c00._4_4_ = iStack_1874 + iStack_18fc;
    lVar7 = in_RDX + (in_RCX + local_2bd0) * 0x40;
    *(int *)(lVar7 + 0x20) = iStack_1870 + local_1908;
    *(int *)(lVar7 + 0x24) = iStack_186c + iStack_1904;
    *(int *)(lVar7 + 0x28) = local_1878 + iStack_1900;
    *(int *)(lVar7 + 0x2c) = iStack_1874 + iStack_18fc;
    local_2c18._4_4_ = local_1858 + iStack_14c4;
    local_2c18._0_4_ = iStack_184c + local_14c8;
    uStack_2c10._0_4_ = iStack_1854 + iStack_14c0;
    uStack_2c10._4_4_ = iStack_1850 + iStack_14bc;
    lVar7 = in_RDX + (in_RCX + local_2bd0) * 0x40;
    *(int *)(lVar7 + 0x30) = iStack_184c + local_14c8;
    *(int *)(lVar7 + 0x34) = local_1858 + iStack_14c4;
    *(int *)(lVar7 + 0x38) = iStack_1854 + iStack_14c0;
    *(int *)(lVar7 + 0x3c) = iStack_1850 + iStack_14bc;
  }
  T_58[1]._0_4_ = (uint32_t)local_2be8;
  return (uint32_t)T_58[1];
}

Assistant:

static uint32_t
blockmix_salsa8_xor(const salsa20_blk_t *restrict Bin1,
    const salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin2[r * 2 + 1], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin2[i * 2 + 1], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin2[r * 2], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	XOR4_2(Bin1[r * 2 + 1].q, Bin2[r * 2 + 1].q)

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2 + 1].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2 + 1].q, Bout[r + 1 + i].q)
	}

	return _mm_cvtsi128_si32(X0);
}